

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O0

void Vec_QueCheck(Vec_Que_t *p)

{
  int iVar1;
  float fVar2;
  float fVar3;
  int local_14;
  int child;
  int i;
  Vec_Que_t *p_local;
  
  if (p->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x124,"void Vec_QueCheck(Vec_Que_t *)");
  }
  if (p->nCap < p->nSize) {
    __assert_fail("p->nSize <= p->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x125,"void Vec_QueCheck(Vec_Que_t *)");
  }
  local_14 = 0;
  while( true ) {
    if (p->nSize + -1 <= local_14) {
      while( true ) {
        if (p->nCap <= local_14) {
          if (*p->pHeap != -1) {
            __assert_fail("p->pHeap[0] == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                          ,300,"void Vec_QueCheck(Vec_Que_t *)");
          }
          local_14 = 0;
          while( true ) {
            if (p->nSize + -1 <= local_14) {
              do {
                local_14 = local_14 + 1;
                if (p->nCap <= local_14) {
                  local_14 = 1;
                  do {
                    if (p->nSize <= local_14) {
                      return;
                    }
                    iVar1 = local_14 * 2;
                    if (iVar1 < p->nSize) {
                      fVar2 = Vec_QuePrio(p,p->pHeap[local_14]);
                      fVar3 = Vec_QuePrio(p,p->pHeap[iVar1]);
                      if (fVar2 < fVar3) {
                        __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                                      ,0x136,"void Vec_QueCheck(Vec_Que_t *)");
                      }
                    }
                    if (iVar1 + 1 < p->nSize) {
                      fVar2 = Vec_QuePrio(p,p->pHeap[local_14]);
                      fVar3 = Vec_QuePrio(p,p->pHeap[iVar1 + 1]);
                      if (fVar2 < fVar3) {
                        __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                                      ,0x139,"void Vec_QueCheck(Vec_Que_t *)");
                      }
                    }
                    local_14 = local_14 + 1;
                  } while( true );
                }
              } while (p->pHeap[local_14] == -1);
              __assert_fail("p->pHeap[i] == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0x130,"void Vec_QueCheck(Vec_Que_t *)");
            }
            if (p->pHeap[p->pOrder[local_14]] != local_14) break;
            local_14 = local_14 + 1;
          }
          __assert_fail("p->pHeap[p->pOrder[i]] == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0x12e,"void Vec_QueCheck(Vec_Que_t *)");
        }
        if (p->pOrder[local_14] != -1) break;
        local_14 = local_14 + 1;
      }
      __assert_fail("p->pOrder[i] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0x12a,"void Vec_QueCheck(Vec_Que_t *)");
    }
    if (p->pOrder[local_14] < 1) break;
    local_14 = local_14 + 1;
  }
  __assert_fail("p->pOrder[i] > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                ,0x128,"void Vec_QueCheck(Vec_Que_t *)");
}

Assistant:

static inline void Vec_QueCheck( Vec_Que_t * p )
{
    int i, child;
    assert( p->nSize > 0 );
    assert( p->nSize <= p->nCap );
    // check mapping
    for ( i = 0; i < p->nSize-1; i++ )
        assert( p->pOrder[i] > 0 );
    for ( ; i < p->nCap; i++ )
        assert( p->pOrder[i] == -1 );
    // check heap
    assert( p->pHeap[0] == -1 );
    for ( i = 0; i < p->nSize-1; i++ )
        assert( p->pHeap[p->pOrder[i]] == i );
    for ( i++; i < p->nCap; i++ )
        assert( p->pHeap[i] == -1 );
    // check heap property
    for ( i = 1; i < p->nSize; i++ )
    {
        child = i << 1;
        if ( child < p->nSize )
            assert( Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child]) );
        child++;
        if ( child < p->nSize )
            assert( Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child]) );
    }
}